

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_mp3.h
# Opt level: O0

float drmp3_L3_ldexp_q2(float y,int exp_q2)

{
  uint local_18;
  uint local_10;
  int e;
  int exp_q2_local;
  float y_local;
  
  local_10 = exp_q2;
  e = (int)y;
  do {
    if ((int)local_10 < 0x78) {
      local_18 = local_10;
    }
    else {
      local_18 = 0x78;
    }
    e = (int)(drmp3_L3_ldexp_q2::g_expfrac[(int)(local_18 & 3)] *
              (float)(0x40000000 >> ((byte)((int)local_18 >> 2) & 0x1f)) * (float)e);
    local_10 = local_10 - local_18;
  } while (0 < (int)local_10);
  return (float)e;
}

Assistant:

static float drmp3_L3_ldexp_q2(float y, int exp_q2)
{
    static const float g_expfrac[4] = { 9.31322575e-10f,7.83145814e-10f,6.58544508e-10f,5.53767716e-10f };
    int e;
    do
    {
        e = DRMP3_MIN(30*4, exp_q2);
        y *= g_expfrac[e & 3]*(1 << 30 >> (e >> 2));
    } while ((exp_q2 -= e) > 0);
    return y;
}